

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::IsSpecConstant(ScalarReplacementPass *this,uint32_t id)

{
  Op opcode;
  int32_t iVar1;
  DefUseManager *this_00;
  Instruction *this_01;
  Instruction *inst;
  uint32_t id_local;
  ScalarReplacementPass *this_local;
  
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  this_01 = analysis::DefUseManager::GetDef(this_00,id);
  if (this_01 != (Instruction *)0x0) {
    opcode = Instruction::opcode(this_01);
    iVar1 = spvOpcodeIsSpecConstant(opcode);
    return iVar1 != 0;
  }
  __assert_fail("inst",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0x24d,"bool spvtools::opt::ScalarReplacementPass::IsSpecConstant(uint32_t) const");
}

Assistant:

bool ScalarReplacementPass::IsSpecConstant(uint32_t id) const {
  const Instruction* inst = get_def_use_mgr()->GetDef(id);
  assert(inst);
  return spvOpcodeIsSpecConstant(inst->opcode());
}